

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.hpp
# Opt level: O0

SampleInfo * __thiscall Transformed::sampleSurface(Transformed *this,Sampler *sampler)

{
  point p;
  undefined8 in_RDX;
  vec4f *in_RSI;
  SampleInfo *in_RDI;
  float fVar1;
  mat4f *a;
  vec3f vVar2;
  vec3f N2;
  vec3f N1;
  SampleInfo info;
  vec3f *b;
  vec3f *a_00;
  mat4f *in_stack_fffffffffffffe60;
  SampleInfo *v;
  mat4f *in_stack_fffffffffffffe80;
  undefined8 local_160;
  float local_158;
  vec3f *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  vec3f *in_stack_fffffffffffffec0;
  vec4f local_100;
  vec4f local_f0;
  undefined8 local_e0;
  float local_d8;
  undefined8 local_d0;
  float local_c8;
  vec3f local_c0;
  vec3f local_b0 [5];
  undefined8 local_70;
  float local_68;
  vec3f local_60;
  undefined8 local_50;
  float local_48;
  vec3f local_44;
  vec3f local_38;
  undefined1 local_2c [12];
  vec3f local_20;
  float local_14;
  
  v = in_RDI;
  (**(code **)(**(long **)&in_RSI->z + 0x10))(local_2c,*(long **)&in_RSI->z,in_RDX);
  vec3f::vec3f(&local_38);
  vec3f::vec3f(&local_44);
  a_00 = &local_20;
  getLocalBasis(in_stack_fffffffffffffec0,
                (vec3f *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                in_stack_fffffffffffffeb0);
  vVar2 = transformedPoint(in_stack_fffffffffffffe60,(vec3f *)(in_RSI + 1));
  local_60.z = vVar2.z;
  local_48 = local_60.z;
  local_60._0_8_ = vVar2._0_8_;
  local_50._0_4_ = local_60.x;
  local_50._4_4_ = local_60.y;
  b = local_b0;
  local_60 = vVar2;
  transposed(in_stack_fffffffffffffe80);
  vVar2 = transformedDir(in_stack_fffffffffffffe80,&v->p);
  local_c0.z = vVar2.z;
  local_68 = local_c0.z;
  local_c0._0_8_ = vVar2._0_8_;
  local_70._0_4_ = local_c0.x;
  local_70._4_4_ = local_c0.y;
  a = (mat4f *)(double)local_14;
  local_c0 = vVar2;
  vec4f::vec4f(&local_100,&local_38,0.0);
  local_f0 = ::operator*(a,(vec4f *)in_RDI);
  vVar2 = vec4f::xyz(in_RSI);
  local_d8 = vVar2.z;
  local_e0 = vVar2._0_8_;
  vec4f::vec4f((vec4f *)&stack0xfffffffffffffec0,&local_44,0.0);
  ::operator*(a,(vec4f *)in_RDI);
  vec4f::xyz(in_RSI);
  vVar2 = cross(a_00,b);
  local_158 = vVar2.z;
  local_c8 = local_158;
  local_160 = vVar2._0_8_;
  local_d0 = local_160;
  fVar1 = norm((vec3f *)0x112b2e);
  p.z = local_48;
  p.x = (float)(undefined4)local_50;
  p.y = (float)local_50._4_4_;
  vVar2.z = local_68;
  vVar2.x = (float)(undefined4)local_70;
  vVar2.y = (float)local_70._4_4_;
  Primitive::SampleInfo::SampleInfo(in_RDI,p,vVar2,(float)((double)a / ABS((double)fVar1)));
  return v;
}

Assistant:

SampleInfo sampleSurface(Sampler& sampler) const
	{
		SampleInfo info = inner->sampleSurface(sampler);
		vec3f N1,N2;
		getLocalBasis(info.normal, N1, N2);
		return SampleInfo(transformedPoint(trans, info.p),
			transformedDir(transposed(invTrans), info.normal),
			info.pdf / fabs(norm(cross((trans*vec4f(N1,0)).xyz(), (trans*vec4f(N2,0)).xyz()))));
	}